

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Buffer.cpp
# Opt level: O1

void __thiscall Buffer::Update(Buffer *this,iterator it)

{
  size_t *psVar1;
  int iVar2;
  _List_node_base *p_Var3;
  
  iVar2 = *(int *)&it._M_node[1]._M_next;
  psVar1 = &(this->Occupy_Block).super__List_base<int,_std::allocator<int>_>._M_impl._M_node._M_size
  ;
  *psVar1 = *psVar1 - 1;
  std::__detail::_List_node_base::_M_unhook();
  operator_delete(it._M_node,0x18);
  p_Var3 = (_List_node_base *)operator_new(0x18);
  *(int *)&p_Var3[1]._M_next = iVar2;
  std::__detail::_List_node_base::_M_hook(p_Var3);
  psVar1 = &(this->Occupy_Block).super__List_base<int,_std::allocator<int>_>._M_impl._M_node._M_size
  ;
  *psVar1 = *psVar1 + 1;
  this->Dirty[iVar2] = 1;
  this->Pin[iVar2] = 0;
  return;
}

Assistant:

void Buffer::Update(list<int>::iterator it) {
	int pos = *it;
	it = this->Occupy_Block.erase(it);
	this->Occupy_Block.push_back(pos);
	this->Dirt(pos);
	this->UnLock(pos);							//������棬���Ա��滻��ȥ
}